

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void * lua_newuserdata(lua_State *L,size_t size)

{
  StkId pTVar1;
  Udata *pUVar2;
  Udata *x_;
  
  pUVar2 = luaS_newudata(L,size);
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)pUVar2;
  pTVar1->tt_ = 0x47;
  L->top = L->top + 1;
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  return pUVar2 + 1;
}

Assistant:

LUA_API void *lua_newuserdata (lua_State *L, size_t size) {
  Udata *u;
  lua_lock(L);
  u = luaS_newudata(L, size);
  setuvalue(L, L->top, u);
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
  return getudatamem(u);
}